

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizerDiscardTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::RasterizerDiscardCase::iterate(RasterizerDiscardCase *this)

{
  byte bVar1;
  bool bVar2;
  deUint32 dVar3;
  GLint location;
  int iVar4;
  int iVar5;
  GLenum GVar6;
  TestLog *pTVar7;
  RenderTarget *this_00;
  MessageBuilder *pMVar8;
  reference pointer;
  float *value;
  RenderTarget *this_01;
  size_type sVar9;
  RenderContext *context;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  char (*local_d38) [8];
  MessageBuilder local_bb0;
  MessageBuilder local_a30;
  MessageBuilder local_8b0;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  LogImage local_6e0;
  byte local_649;
  RGBA local_648;
  RGBA RStack_644;
  bool testOk;
  int local_640;
  int local_63c;
  int x;
  int y;
  int height;
  int width;
  undefined1 local_608 [8];
  Surface pixels;
  MessageBuilder local_5e8 [2];
  NotSupportedError *e;
  InternalError *e_1;
  string local_100;
  int local_cc;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string header;
  vector<float,_std::allocator<float>_> vertices;
  bool passColorFound;
  bool failColorFound;
  deUint32 colorUnif;
  RenderTarget *renderTarget;
  TestLog *log;
  RasterizerDiscardCase *this_local;
  
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  location = glwGetUniformLocation(dVar3,"u_color");
  bVar1 = 0;
  bVar2 = false;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)((long)&header.field_2 + 8));
  local_cc = this->m_iterNdx + 1;
  de::toString<int>(&local_c8,&local_cc);
  std::operator+(&local_a8,"Case iteration ",&local_c8);
  std::operator+(&local_88,&local_a8," / ");
  de::toString<int>(&local_100,&NUM_CASE_ITERATIONS);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  tcu::LogSection::LogSection((LogSection *)&e_1,(string *)local_68,(string *)local_68);
  tcu::TestLog::operator<<(pTVar7,(Section *)&e_1);
  tcu::LogSection::~LogSection((LogSection *)&e_1);
  if ((this->m_caseOptions & 1) != 0) {
    setupFramebufferObject(this);
  }
  if ((this->m_caseOptions & 2) != 0) {
    glwEnable(0xc11);
    iVar4 = tcu::RenderTarget::getWidth(this_00);
    iVar5 = tcu::RenderTarget::getHeight(this_00);
    glwScissor(0,0,iVar4,iVar5);
    tcu::TestLog::operator<<(local_5e8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (local_5e8,(char (*) [39])"Scissor test enabled: glScissor(0, 0, ");
    pixels.m_pixels.m_cap._4_4_ = tcu::RenderTarget::getWidth(this_00);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&pixels.m_pixels.m_cap + 4));
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pixels.m_pixels.m_cap._0_4_ = tcu::RenderTarget::getHeight(this_00);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&pixels.m_pixels.m_cap);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x130f08e);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(local_5e8);
  }
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  glwUseProgram(dVar3);
  glwEnable(0xb71);
  glwDepthRangef(0.0,1.0);
  glwDepthFunc(0x203);
  glwEnable(0xb90);
  glwStencilFunc(0x205,1,0xff);
  glwStencilOp(0x1e01,0x1e00,0x1e00);
  fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)PASS_COLOR_BLUE);
  fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)PASS_COLOR_BLUE);
  fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)PASS_COLOR_BLUE);
  fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)PASS_COLOR_BLUE);
  glwClearColor(fVar10,fVar11,fVar12,fVar13);
  glwClearDepthf(1.0);
  glwClearStencil(0);
  glwClear(0x4500);
  glwEnableVertexAttribArray(0);
  generateVertices((vector<float,_std::allocator<float>_> *)((long)&header.field_2 + 8),
                   this->m_numPrimitives,&this->m_rnd,this->m_drawMode);
  pointer = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)((long)&header.field_2 + 8),0);
  glwVertexAttribPointer(0,4,0x1406,'\0',0,pointer);
  if ((this->m_caseType == CASE_CLEAR_DEPTH) || (this->m_caseType == CASE_CLEAR_STENCIL)) {
    fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)BLACK_COLOR);
    fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)BLACK_COLOR);
    fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)BLACK_COLOR);
    fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)BLACK_COLOR);
    glwClearColor(fVar10,fVar11,fVar12,fVar13);
    glwClear(0x4000);
  }
  fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)FAIL_COLOR_RED);
  fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)FAIL_COLOR_RED);
  fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)FAIL_COLOR_RED);
  fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)FAIL_COLOR_RED);
  glwUniform4f(location,fVar10,fVar11,fVar12,fVar13);
  fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)FAIL_COLOR_RED);
  fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)FAIL_COLOR_RED);
  fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)FAIL_COLOR_RED);
  fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)FAIL_COLOR_RED);
  glwClearColor(fVar10,fVar11,fVar12,fVar13);
  glwClearDepthf(0.0);
  glwClearStencil(1);
  glwEnable(0x8c89);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"Rasterizer discard enabled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizerDiscardTests.cpp"
                  ,0x148);
  switch(this->m_caseType) {
  case CASE_WRITE_DEPTH:
    GVar6 = this->m_drawMode;
    sVar9 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)((long)&header.field_2 + 8));
    iVar4 = (int)sVar9;
    if (iVar4 < 0) {
      iVar4 = iVar4 + 3;
    }
    glwDrawArrays(GVar6,0,iVar4 >> 2);
    break;
  case CASE_WRITE_STENCIL:
    GVar6 = this->m_drawMode;
    sVar9 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)((long)&header.field_2 + 8));
    iVar4 = (int)sVar9;
    if (iVar4 < 0) {
      iVar4 = iVar4 + 3;
    }
    glwDrawArrays(GVar6,0,iVar4 >> 2);
    break;
  case CASE_CLEAR_COLOR:
    if ((this->m_caseOptions & 1) == 0) {
      glwClear(0x4000);
    }
    else {
      value = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)FAIL_COLOR_RED,0);
      glwClearBufferfv(0x1800,0,value);
    }
    break;
  case CASE_CLEAR_DEPTH:
    if ((this->m_caseOptions & 1) == 0) {
      glwClear(0x100);
    }
    else {
      glwClearBufferfv(0x1801,0,(GLfloat *)&FAIL_DEPTH);
    }
    break;
  case CASE_CLEAR_STENCIL:
    if ((this->m_caseOptions & 1) == 0) {
      glwClear(0x400);
    }
    else {
      glwClearBufferiv(0x1802,0,&FAIL_STENCIL);
    }
  }
  glwDisable(0x8c89);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"Rasterizer discard disabled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fRasterizerDiscardTests.cpp"
                  ,0x159);
  if (this->m_caseType == CASE_WRITE_STENCIL) {
    if ((this->m_caseOptions & 1) == 0) {
      this_01 = Context::getRenderTarget((this->super_TestCase).m_context);
      iVar4 = tcu::RenderTarget::getStencilBits(this_01);
      if (iVar4 < 1) goto LAB_009b1c81;
    }
    glwVertexAttribPointer(0,4,0x1406,'\0',0,UNIT_SQUARE);
    glwStencilFunc(0x202,1,0xff);
    glwDrawArrays(5,0,4);
  }
  else if ((this->m_caseType == CASE_CLEAR_DEPTH) || (this->m_caseType == CASE_CLEAR_STENCIL)) {
    fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)PASS_COLOR_BLUE);
    fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)PASS_COLOR_BLUE);
    fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)PASS_COLOR_BLUE);
    fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)PASS_COLOR_BLUE);
    glwUniform4f(location,fVar10,fVar11,fVar12,fVar13);
    GVar6 = this->m_drawMode;
    sVar9 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)((long)&header.field_2 + 8));
    iVar4 = (int)sVar9;
    if (iVar4 < 0) {
      iVar4 = iVar4 + 3;
    }
    glwDrawArrays(GVar6,0,iVar4 >> 2);
  }
LAB_009b1c81:
  glwFinish();
  glwDisable(0xb90);
  glwDisable(0xb71);
  glwDisable(0xc11);
  iVar4 = tcu::RenderTarget::getWidth(this_00);
  iVar5 = tcu::RenderTarget::getHeight(this_00);
  tcu::Surface::Surface((Surface *)local_608,iVar4,iVar5);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&height,(Surface *)local_608);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&height);
  y = tcu::Surface::getWidth((Surface *)local_608);
  x = tcu::Surface::getHeight((Surface *)local_608);
  for (local_63c = 0; local_63c < x; local_63c = local_63c + 1) {
    for (local_640 = 0; local_640 < y; local_640 = local_640 + 1) {
      RStack_644 = tcu::Surface::getPixel((Surface *)local_608,local_640,local_63c);
      iVar4 = tcu::RGBA::getBlue(&stack0xfffffffffffff9bc);
      if (iVar4 != 0) {
        bVar2 = true;
      }
      local_648 = tcu::Surface::getPixel((Surface *)local_608,local_640,local_63c);
      iVar4 = tcu::RGBA::getRed(&local_648);
      if (iVar4 != 0) {
        bVar1 = 1;
        break;
      }
    }
    if (bVar1 != 0) break;
  }
  if ((this->m_caseOptions & 1) != 0) {
    deleteFramebufferObject(this);
  }
  local_649 = 0;
  if (bVar2) {
    local_649 = bVar1 ^ 1;
  }
  if (local_649 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,"Result image",&local_701);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_728,"Result image",&local_729);
    tcu::LogImage::LogImage
              (&local_6e0,&local_700,&local_728,(Surface *)local_608,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::TestLog::operator<<(pTVar7,&local_6e0);
    tcu::LogImage::~LogImage(&local_6e0);
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator(&local_729);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator(&local_701);
  }
  tcu::TestLog::operator<<(&local_8b0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_8b0,(char (*) [14])0x127a9b2);
  if ((local_649 & 1) == 0) {
    local_d38 = (char (*) [8])0x127a9c8;
  }
  else {
    local_d38 = (char (*) [8])0x127a9c0;
  }
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_d38);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8b0);
  if ((local_649 & 1) == 0) {
    tcu::TestLog::operator<<(&local_a30,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_a30,(char (*) [45])"Primitive or buffer clear was not discarded.");
    pTVar7 = tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::operator<<(pTVar7,(EndSectionToken *)&tcu::TestLog::EndSection);
    tcu::MessageBuilder::~MessageBuilder(&local_a30);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
    this_local._4_4_ = STOP;
  }
  else {
    tcu::TestLog::operator<<(&local_bb0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_bb0,
                        (char (*) [51])"Primitive or buffer clear was discarded correctly.");
    pTVar7 = tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::TestLog::operator<<(pTVar7,(EndSectionToken *)&tcu::TestLog::EndSection);
    tcu::MessageBuilder::~MessageBuilder(&local_bb0);
    iVar4 = this->m_iterNdx + 1;
    this->m_iterNdx = iVar4;
    this_local._4_4_ = (IterateResult)(iVar4 < 1);
  }
  e._4_4_ = 1;
  tcu::Surface::~Surface((Surface *)local_608);
  std::__cxx11::string::~string((string *)local_68);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)((long)&header.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

RasterizerDiscardCase::IterateResult RasterizerDiscardCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	deUint32					colorUnif		= glGetUniformLocation(m_program->getProgram(), "u_color");
	bool						failColorFound	= false;
	bool						passColorFound	= false;
	std::vector<float>			vertices;

	std::string header = "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	log << TestLog::Section(header, header);

	DE_ASSERT (m_program);

	// Create and bind FBO if needed

	if (m_caseOptions & CASEOPTION_FBO)
	{
		try
		{
			setupFramebufferObject();
		}
		catch (tcu::NotSupportedError& e)
		{
			log << TestLog::Message << "ERROR: " << e.what() << "." << TestLog::EndMessage << TestLog::EndSection;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		catch (tcu::InternalError& e)
		{
			log << TestLog::Message << "ERROR: " << e.what() << "." << TestLog::EndMessage << TestLog::EndSection;
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
			return STOP;
		}
	}

	if (m_caseOptions & CASEOPTION_SCISSOR)
	{
		glEnable (GL_SCISSOR_TEST);
		glScissor(0, 0, renderTarget.getWidth(), renderTarget.getHeight());
		log << TestLog::Message << "Scissor test enabled: glScissor(0, 0, " << renderTarget.getWidth() << ", " << renderTarget.getHeight() << ")" << TestLog::EndMessage;
	}

	glUseProgram	(m_program->getProgram());

	glEnable		(GL_DEPTH_TEST);
	glDepthRangef	(0.0f, 1.0f);
	glDepthFunc		(GL_LEQUAL);

	glEnable		(GL_STENCIL_TEST);
	glStencilFunc	(GL_NOTEQUAL, 1, 0xFF);
	glStencilOp		(GL_REPLACE, GL_KEEP, GL_KEEP);

	glClearColor	(PASS_COLOR_BLUE.x(), PASS_COLOR_BLUE.y(), PASS_COLOR_BLUE.z(), PASS_COLOR_BLUE.w());
	glClearDepthf	(1.0f);
	glClearStencil	(0);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray (0);
	generateVertices		  (vertices, m_numPrimitives, m_rnd, m_drawMode);
	glVertexAttribPointer	  (0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);

	// Clear color to black for depth and stencil clear cases

	if (m_caseType == CASE_CLEAR_DEPTH || m_caseType == CASE_CLEAR_STENCIL)
	{
		glClearColor	(BLACK_COLOR.x(), BLACK_COLOR.y(), BLACK_COLOR.z(), BLACK_COLOR.w());
		glClear			(GL_COLOR_BUFFER_BIT);
	}

	// Set fail values for color, depth and stencil

	glUniform4f		(colorUnif, FAIL_COLOR_RED.x(), FAIL_COLOR_RED.y(), FAIL_COLOR_RED.z(), FAIL_COLOR_RED.w());
	glClearColor	(FAIL_COLOR_RED.x(), FAIL_COLOR_RED.y(), FAIL_COLOR_RED.z(), FAIL_COLOR_RED.w());
	glClearDepthf	(FAIL_DEPTH);
	glClearStencil	(FAIL_STENCIL);

	// Enable rasterizer discard

	glEnable		(GL_RASTERIZER_DISCARD);
	GLU_CHECK_MSG	("Rasterizer discard enabled");

	// Do to-be-discarded primitive draws and buffer clears

	switch (m_caseType)
	{
		case CASE_WRITE_DEPTH:			glDrawArrays(m_drawMode, 0, (int)vertices.size() / 4);																	break;
		case CASE_WRITE_STENCIL:		glDrawArrays(m_drawMode, 0, (int)vertices.size() / 4);																	break;
		case CASE_CLEAR_COLOR:			(m_caseOptions & CASEOPTION_FBO) ? glClearBufferfv(GL_COLOR, 0, &FAIL_COLOR_RED[0])	: glClear(GL_COLOR_BUFFER_BIT);		break;
		case CASE_CLEAR_DEPTH:			(m_caseOptions & CASEOPTION_FBO) ? glClearBufferfv(GL_DEPTH, 0, &FAIL_DEPTH)		: glClear(GL_DEPTH_BUFFER_BIT);		break;
		case CASE_CLEAR_STENCIL:		(m_caseOptions & CASEOPTION_FBO) ? glClearBufferiv(GL_STENCIL, 0, &FAIL_STENCIL)	: glClear(GL_STENCIL_BUFFER_BIT);	break;
		default:						DE_ASSERT(false);
	}

	// Disable rasterizer discard

	glDisable		(GL_RASTERIZER_DISCARD);
	GLU_CHECK_MSG	("Rasterizer discard disabled");

	if (m_caseType == CASE_WRITE_STENCIL)
	{
		if ((m_caseOptions & CASEOPTION_FBO) || m_context.getRenderTarget().getStencilBits() > 0)
		{
			// Draw a full-screen square that colors all pixels red if they have stencil value 1.

			glVertexAttribPointer (0, 4, GL_FLOAT, GL_FALSE, 0, &UNIT_SQUARE[0]);
			glStencilFunc		  (GL_EQUAL, 1, 0xFF);
			glDrawArrays		  (GL_TRIANGLE_STRIP, 0, 4);
		}
		// \note If no stencil buffers are present and test is rendering to default framebuffer, test will always pass.
	}
	else if (m_caseType == CASE_CLEAR_DEPTH || m_caseType == CASE_CLEAR_STENCIL)
	{
		// Draw pass-indicating primitives for depth and stencil clear cases

		glUniform4f	 (colorUnif, PASS_COLOR_BLUE.x(), PASS_COLOR_BLUE.y(), PASS_COLOR_BLUE.z(), PASS_COLOR_BLUE.w());
		glDrawArrays (m_drawMode, 0, (int)vertices.size() / 4);
	}

	glFinish  ();
	glDisable (GL_STENCIL_TEST);
	glDisable (GL_DEPTH_TEST);
	glDisable (GL_SCISSOR_TEST);

	// Read and check pixel data

	tcu::Surface pixels(renderTarget.getWidth(), renderTarget.getHeight());
	glu::readPixels(m_context.getRenderContext(), 0, 0, pixels.getAccess());

	{
		int width = pixels.getWidth();
		int height = pixels.getHeight();

		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				if (pixels.getPixel(x,y).getBlue() != 0)
					passColorFound = true;

				if (pixels.getPixel(x,y).getRed() != 0)
				{
					failColorFound = true;
					break;
				}
			}
			if (failColorFound) break;
		}
	}

	// Delete FBO if created

	if (m_caseOptions & CASEOPTION_FBO)
		deleteFramebufferObject();

	// Evaluate test result

	bool testOk = passColorFound && !failColorFound;

	if (!testOk)
		log << TestLog::Image ("Result image", "Result image", pixels);
	log << TestLog::Message << "Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		log << TestLog::Message << "Primitive or buffer clear was not discarded." << TestLog::EndMessage << TestLog::EndSection;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "Primitive or buffer clear was discarded correctly." << TestLog::EndMessage << TestLog::EndSection;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}